

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

bool __thiscall
GLRParser::checkProductionRules
          (GLRParser *this,
          vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
          *possibleParseStacks,
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *stack,stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                 *productions,GLRState *currentState,
          set<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
          *alreadyReducedStacks,bool final)

{
  bool bVar1;
  __type _Var2;
  operation oVar3;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *this_00;
  reference ppPVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  const_reference __lhs;
  ParseOperation *pPVar5;
  reference ppPVar6;
  ulong uVar7;
  Production *pPVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  size_type sVar10;
  string *psVar11;
  reference stateName_00;
  GLRState *pGVar12;
  pair<std::_Rb_tree_const_iterator<ParseOperation_*>,_bool> pVar13;
  bool local_389;
  undefined1 local_368 [8];
  string stateName;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newNewStack;
  ParseOperation *stackOp;
  iterator __end3;
  iterator __begin3;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_> *__range3;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  parseOperationsb;
  GLRState *currentTopState;
  string newVariable;
  undefined1 local_270 [4];
  int i;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> newProductions;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newStack;
  ParseOperation *parseOperation;
  iterator __end2_1;
  iterator __begin2_1;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_> *__range2_1;
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>
  local_1a0;
  _Base_ptr local_148;
  undefined1 local_140;
  ParseOperation *local_138;
  _Self local_130;
  byte local_121;
  pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>
  local_120;
  _Self local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Production *local_90;
  Production *prod;
  iterator __end2;
  iterator __begin2;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *__range2;
  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
  parseOperations;
  bool finalStack;
  bool final_local;
  set<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
  *alreadyReducedStacks_local;
  GLRState *currentState_local;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *productions_local;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *stack_local;
  vector<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>_>
  *possibleParseStacks_local;
  GLRParser *this_local;
  
  parseOperations._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = final;
  parseOperations._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  bVar1 = GLRState::isAccepting(currentState);
  if (bVar1) {
    std::set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>::set
              ((set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                *)&__range2);
    this_00 = GLRState::getProductions(currentState);
    __end2 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::begin
                       (this_00);
    prod = (Production *)
           std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::end
                     (this_00);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&prod), bVar1) {
      ppPVar4 = std::_Rb_tree_const_iterator<Production_*>::operator*(&__end2);
      local_90 = *ppPVar4;
      local_121 = 0;
      pvVar9 = Production::getToP_abi_cxx11_(local_90);
      this_01 = Production::getToP_abi_cxx11_(local_90);
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(this_01);
      __lhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](pvVar9,sVar10 - 1);
      getMarker_abi_cxx11_();
      _Var2 = std::operator==(__lhs,&local_c0);
      local_389 = false;
      if (_Var2) {
        std::
        pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>
        ::pair<Production_*&,_true>(&local_120,stack,&local_90);
        local_121 = 1;
        local_c8._M_node =
             (_Base_ptr)
             std::
             set<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
             ::find(alreadyReducedStacks,&local_120);
        local_130._M_node =
             (_Base_ptr)
             std::
             set<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
             ::end(alreadyReducedStacks);
        local_389 = std::operator==(&local_c8,&local_130);
      }
      if ((local_121 & 1) != 0) {
        std::
        pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>
        ::~pair(&local_120);
      }
      std::__cxx11::string::~string((string *)&local_c0);
      if (local_389 != false) {
        pPVar5 = (ParseOperation *)operator_new(0x18);
        ParseOperation::ParseOperation(pPVar5,local_90);
        local_138 = pPVar5;
        pVar13 = std::
                 set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                 ::insert((set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                           *)&__range2,&local_138);
        local_148 = (_Base_ptr)pVar13.first._M_node;
        local_140 = pVar13.second;
        std::
        pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>
        ::pair<Production_*&,_true>(&local_1a0,stack,&local_90);
        std::
        set<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>,_std::less<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>,_std::allocator<std::pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>_>_>
        ::insert(alreadyReducedStacks,&local_1a0);
        std::
        pair<std::stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Production_*>
        ::~pair(&local_1a0);
      }
      std::_Rb_tree_const_iterator<Production_*>::operator++(&__end2);
    }
    __end2_1 = std::
               set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
               ::begin((set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                        *)&__range2);
    parseOperation =
         (ParseOperation *)
         std::set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
         ::end((set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                *)&__range2);
    while (bVar1 = std::operator!=(&__end2_1,(_Self *)&parseOperation), bVar1) {
      ppPVar6 = std::_Rb_tree_const_iterator<ParseOperation_*>::operator*(&__end2_1);
      pPVar5 = *ppPVar6;
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&newProductions.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node,stack);
      std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>::stack
                ((stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *)
                 local_270,productions);
      newVariable.field_2._12_4_ = 0;
      while( true ) {
        uVar7 = (ulong)(int)newVariable.field_2._12_4_;
        pPVar8 = ParseOperation::getReduceProduction(pPVar5);
        pvVar9 = Production::getToP_abi_cxx11_(pPVar8);
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(pvVar9);
        if (sVar10 - 1 <= uVar7) break;
        bVar1 = std::
                stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&newProductions.c.
                            super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node);
        if (!bVar1) {
          std::
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::pop((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&newProductions.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node);
        }
        bVar1 = std::
                stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&newProductions.c.
                            super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node);
        if (!bVar1) {
          std::
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::pop((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&newProductions.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_node);
        }
        newVariable.field_2._12_4_ = newVariable.field_2._12_4_ + 1;
      }
      bVar1 = std::
              stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&newProductions.c.
                          super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node);
      if (bVar1) {
        newVariable.field_2._8_4_ = 5;
      }
      else {
        pPVar8 = ParseOperation::getReduceProduction(pPVar5);
        psVar11 = Production::getFromP_abi_cxx11_(pPVar8);
        std::__cxx11::string::string((string *)&currentTopState,(string *)psVar11);
        stateName_00 = std::
                       stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::top((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&newProductions.c.
                                 super__Deque_base<Production_*,_std::allocator<Production_*>_>.
                                 _M_impl.super__Deque_impl_data._M_finish._M_node);
        pGVar12 = findState(this,stateName_00);
        std::
        stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&newProductions.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node,(value_type *)&currentTopState);
        parseOperationsb._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)ParseOperation::getReduceProduction(pPVar5);
        std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>::push
                  ((stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *)
                   local_270,
                   (value_type *)&parseOperationsb._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        findParseOptions((set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                          *)&__range3,this,(string *)&currentTopState,pGVar12);
        __end3 = std::
                 set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                 ::begin((set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                          *)&__range3);
        stackOp = (ParseOperation *)
                  std::
                  set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                  ::end((set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                         *)&__range3);
        while (bVar1 = std::operator!=(&__end3,(_Self *)&stackOp), bVar1) {
          ppPVar6 = std::_Rb_tree_const_iterator<ParseOperation_*>::operator*(&__end3);
          pPVar5 = *ppPVar6;
          std::
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&stateName.field_2 + 8),
                  (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&newProductions.c.
                      super__Deque_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node);
          std::__cxx11::string::string((string *)local_368);
          oVar3 = ParseOperation::getOperationType(pPVar5);
          if (oVar3 == accept) {
            parseOperations._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ =
                 parseOperations._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1;
            std::__cxx11::string::operator=((string *)local_368,"accept");
          }
          else {
            pGVar12 = ParseOperation::getNewState(pPVar5);
            psVar11 = GLRState::getName_abi_cxx11_(pGVar12);
            std::__cxx11::string::operator=((string *)local_368,(string *)psVar11);
          }
          std::
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&stateName.field_2 + 8),(value_type *)local_368);
          std::
          vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
          ::
          emplace_back<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>&>
                    ((vector<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>,std::allocator<std::pair<std::stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::stack<Production*,std::deque<Production*,std::allocator<Production*>>>>>>
                      *)possibleParseStacks,
                     (stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&stateName.field_2 + 8),
                     (stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                      *)local_270);
          std::__cxx11::string::~string((string *)local_368);
          std::
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&stateName.field_2 + 8));
          std::_Rb_tree_const_iterator<ParseOperation_*>::operator++(&__end3);
        }
        std::set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>::
        ~set((set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
              *)&__range3);
        std::__cxx11::string::~string((string *)&currentTopState);
        newVariable.field_2._8_4_ = 0;
      }
      std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>::~stack
                ((stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> *)
                 local_270);
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~stack((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&newProductions.c.super__Deque_base<Production_*,_std::allocator<Production_*>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node);
      std::_Rb_tree_const_iterator<ParseOperation_*>::operator++(&__end2_1);
    }
    std::set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>::~set
              ((set<ParseOperation_*,_std::less<ParseOperation_*>,_std::allocator<ParseOperation_*>_>
                *)&__range2);
  }
  return (bool)(parseOperations._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1);
}

Assistant:

bool
GLRParser::checkProductionRules(
        vector<pair<std::stack<std::string>, std::stack<Production *>>> &possibleParseStacks,
        const std::stack<std::string> &stack,
        const std::stack<Production *> &productions,
        const GLRState *currentState,
        set<pair<std::stack<std::string>, Production *>> &alreadyReducedStacks,
        bool final) {// Check for possible reduces

    bool finalStack = false;
    if (currentState->isAccepting()) {
        // TODO: push production on stack
        set<ParseOperation *> parseOperations;

        // Find the possible reduces
        for (auto prod: currentState->getProductions()) {
            if (prod->getToP()[prod->getToP().size() - 1] == getMarker() &&
                alreadyReducedStacks.find(std::pair<std::stack<std::string>, Production *>(stack, prod)) ==
                alreadyReducedStacks.end()) {
                parseOperations.insert(new ParseOperation(prod));
                alreadyReducedStacks.insert(std::pair<std::stack<std::string>, Production *>(stack, prod));
            }
        }

        for (ParseOperation *parseOperation: parseOperations) {
            std::stack<std::string> newStack = stack;
            std::stack<Production *> newProductions = productions;

            // Pop the left side of the production from the stack
            for (int i = 0; i < parseOperation->getReduceProduction()->getToP().size() - 1; ++i) {
                // pop all elements from the stack (exclude the marker)
                if(!newStack.empty())
                    newStack.pop(); // pop the state marker
                if(!newStack.empty())
                    newStack.pop(); // pop the string element
            }

            if(newStack.empty())
                continue;

            // Push the right side and determine the new top state
            string newVariable = parseOperation->getReduceProduction()->getFromP();
            GLRState *currentTopState = findState(newStack.top());
            newStack.push(newVariable);
            newProductions.push(parseOperation->getReduceProduction());

            set<ParseOperation *> parseOperationsb = findParseOptions(newVariable, currentTopState);

            for (auto stackOp: parseOperationsb) {

                // For every new possible stack, create a new state
                std::stack<string> newNewStack = newStack;
                std::string stateName;
                if (stackOp->getOperationType() == ParseOperation::accept) {
//                    if (!final) {
//                        continue;
//                    }
//                    std::stack<std::string> acceptStack;
//                    acceptStack.push("accept");
//                    possibleParseStacks.emplace_back(acceptStack,
//                                                     newProductions);
                    finalStack = final;
                    stateName = "accept";
                } else {
                    stateName = stackOp->getNewState()->getName();
                }
                newNewStack.push(stateName);
                // Add this to the possibleParseStacks, so it can still be evaluated this round. (because this stack hasn't yet consumed char c)
                possibleParseStacks.emplace_back(newNewStack,
                                                 newProductions); // i (on which we're iterating) mustn't decrease, because we're checking the size & inserting at the end

//                cout << "Reduced, new stack: ";
//                printStack(newNewStack);
//                cout << endl;
            }
        }
    }


    return finalStack;
}